

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O2

int miniros::network::init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  unsigned_long uVar4;
  InvalidPortException *this;
  key_type kStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_68,"__hostname",(allocator<char> *)&local_48);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)ctx,&kStack_68);
  std::__cxx11::string::~string((string *)&kStack_68);
  if (cVar2._M_node == (_Base_ptr)(ctx + 8)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_68,"__ip",(allocator<char> *)&local_48);
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)ctx,&kStack_68);
    std::__cxx11::string::~string((string *)&kStack_68);
    if (cVar3._M_node == cVar2._M_node) goto LAB_00234afe;
  }
  std::__cxx11::string::_M_assign((string *)&g_host_abi_cxx11_);
LAB_00234afe:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_68,"__tcpros_server_port",(allocator<char> *)&local_48);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)ctx,&kStack_68);
  std::__cxx11::string::~string((string *)&kStack_68);
  if (cVar2._M_node != (_Base_ptr)(ctx + 8)) {
    uVar4 = std::__cxx11::stoul((string *)(cVar2._M_node + 2),(size_t *)0x0,10);
    if (0xfffe < uVar4) {
      this = (InvalidPortException *)__cxa_allocate_exception(0x10);
      std::operator+(&local_48,"__tcpros_server_port [",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (cVar2._M_node + 2));
      std::operator+(&kStack_68,&local_48,"] was not specified as a number within the 0-65535 range"
                    );
      InvalidPortException::InvalidPortException(this,&kStack_68);
      __cxa_throw(this,&InvalidPortException::typeinfo,std::runtime_error::~runtime_error);
    }
    g_tcpros_server_port = (undefined2)uVar4;
  }
  iVar1 = 0x300ca8;
  if (DAT_00300cb0 == 0) {
    determineHost_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&g_host_abi_cxx11_,(string *)&kStack_68);
    iVar1 = std::__cxx11::string::~string((string *)&kStack_68);
  }
  return iVar1;
}

Assistant:

void init(const M_string& remappings)
{
  M_string::const_iterator it = remappings.find("__hostname");
  if (it != remappings.end()) {
    g_host = it->second;
  } else {
    it = remappings.find("__ip");
    if (it != remappings.end()) {
      g_host = it->second;
    }
  }

  it = remappings.find("__tcpros_server_port");
  if (it != remappings.end()) {
    bool failed = true;
    try {
      auto rawValue = std::stoul(it->second);
      if (rawValue < 65535) {
        g_tcpros_server_port = rawValue;
        failed = false;
      }
    } catch (std::invalid_argument&) {
    } catch (std::out_of_range&) {
    }

    if (failed) {
      throw miniros::InvalidPortException(
        "__tcpros_server_port [" + it->second + "] was not specified as a number within the 0-65535 range");
    }
  }

  if (g_host.empty()) {
    g_host = determineHost();
  }
}